

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

uint get_terminal_columns(void)

{
  char *pcVar1;
  int iVar2;
  char *in_RAX;
  char *__nptr;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  char *endptr;
  undefined8 local_28;
  
  local_28 = in_RAX;
  __nptr = (char *)curl_getenv();
  if (__nptr != (char *)0x0) {
    uVar3 = strtol(__nptr,(char **)&local_28,10);
    pcVar1 = local_28;
    if (local_28 != __nptr) {
      sVar4 = strlen(__nptr);
      if (pcVar1 == __nptr + sVar4 && uVar3 - 0x15 < 0x26fb) {
        curl_free(__nptr);
        goto LAB_0010aa9d;
      }
    }
    curl_free();
  }
  iVar2 = ioctl(0,0x5413,&local_28);
  uVar5 = (uint)local_28._2_2_;
  if (iVar2 != 0) {
    uVar5 = 0;
  }
  uVar3 = (ulong)uVar5;
  if (9999 < uVar5) {
    uVar3 = 0;
  }
LAB_0010aa9d:
  uVar5 = 0x4f;
  if ((uint)uVar3 != 0) {
    uVar5 = (uint)uVar3;
  }
  return uVar5;
}

Assistant:

unsigned int get_terminal_columns(void)
{
  unsigned int width = 0;
  char *colp = curl_getenv("COLUMNS");
  if(colp) {
    char *endptr;
    long num = strtol(colp, &endptr, 10);
    if((endptr != colp) && (endptr == colp + strlen(colp)) && (num > 20) &&
       (num < 10000))
      width = (unsigned int)num;
    curl_free(colp);
  }

  if(!width) {
    int cols = 0;

#ifdef TIOCGSIZE
    struct ttysize ts;
    if(!ioctl(STDIN_FILENO, TIOCGSIZE, &ts))
      cols = ts.ts_cols;
#elif defined(TIOCGWINSZ)
    struct winsize ts;
    if(!ioctl(STDIN_FILENO, TIOCGWINSZ, &ts))
      cols = (int)ts.ws_col;
#elif defined(_WIN32) && !defined(CURL_WINDOWS_UWP)
    {
      HANDLE  stderr_hnd = GetStdHandle(STD_ERROR_HANDLE);
      CONSOLE_SCREEN_BUFFER_INFO console_info;

      if((stderr_hnd != INVALID_HANDLE_VALUE) &&
         GetConsoleScreenBufferInfo(stderr_hnd, &console_info)) {
        /*
         * Do not use +1 to get the true screen-width since writing a
         * character at the right edge will cause a line wrap.
         */
        cols = (int)
          (console_info.srWindow.Right - console_info.srWindow.Left);
      }
    }
#endif /* TIOCGSIZE */
    if(cols >= 0 && cols < 10000)
      width = (unsigned int)cols;
  }
  if(!width)
    width = 79;
  return width; /* 79 for unknown, might also be very small or very big */
}